

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool __thiscall
wallet::CWallet::SetAddressBookWithDB
          (CWallet *this,WalletBatch *batch,CTxDestination *address,string *strName,
          optional<wallet::AddressPurpose> *new_purpose)

{
  bool bVar1;
  isminetype iVar2;
  iterator iVar3;
  mapped_type *this_00;
  AddressPurpose p;
  char *wallet_fmt;
  _Storage<wallet::AddressPurpose,_true> args_3;
  _Optional_payload_base<wallet::AddressPurpose> _Var4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock51;
  ChangeType local_a8;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_78,&this->cs_wallet,
             "cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
             ,0x983,false);
  iVar3 = std::
          _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
          ::find(&(this->m_address_book)._M_t,address);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->m_address_book)._M_t._M_impl.super__Rb_tree_header
     ) {
    this_00 = std::
              map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
              ::operator[](&this->m_address_book,address);
    local_a8 = CT_NEW;
  }
  else {
    local_a8 = (ChangeType)*(byte *)&iVar3._M_node[4]._M_left;
    this_00 = (mapped_type *)&iVar3._M_node[3]._M_left;
  }
  std::__cxx11::string::string((string *)&local_58,strName);
  std::optional<std::__cxx11::string>::operator=
            ((optional<std::__cxx11::string> *)this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  iVar2 = IsMine(this,address);
  if ((new_purpose->super__Optional_base<wallet::AddressPurpose,_true,_true>)._M_payload.
      super__Optional_payload_base<wallet::AddressPurpose>._M_engaged == false) {
    _Var4 = (this_00->purpose).super__Optional_base<wallet::AddressPurpose,_true,_true>._M_payload.
            super__Optional_payload_base<wallet::AddressPurpose>;
  }
  else {
    _Var4 = (new_purpose->super__Optional_base<wallet::AddressPurpose,_true,_true>)._M_payload.
            super__Optional_payload_base<wallet::AddressPurpose>;
    (this_00->purpose).super__Optional_base<wallet::AddressPurpose,_true,_true>._M_payload.
    super__Optional_payload_base<wallet::AddressPurpose> = _Var4;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_78);
  EncodeDestination_abi_cxx11_(&local_78,address);
  if ((new_purpose->super__Optional_base<wallet::AddressPurpose,_true,_true>)._M_payload.
      super__Optional_payload_base<wallet::AddressPurpose>._M_engaged == true) {
    PurposeToString_abi_cxx11_
              (&local_98,
               (wallet *)
               (ulong)(new_purpose->super__Optional_base<wallet::AddressPurpose,_true,_true>).
                      _M_payload.super__Optional_payload_base<wallet::AddressPurpose>._M_payload.
                      _M_value,p);
    bVar1 = WalletBatch::WritePurpose(batch,&local_78,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    if (bVar1) goto LAB_0014cfd5;
    wallet_fmt = "Error: fail to write address book \'purpose\' entry\n";
  }
  else {
LAB_0014cfd5:
    bVar1 = WalletBatch::WriteName(batch,&local_78,strName);
    if (bVar1) {
      args_3._M_value._1_3_ = 0;
      args_3._M_value._0_1_ = iVar2 == ISMINE_NO;
      if (((ulong)_Var4 >> 0x20 & 1) != 0) {
        args_3 = _Var4._M_payload;
      }
      bVar1 = true;
      boost::signals2::
      signal<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType)>,_boost::signals2::mutex>
      ::operator()(&this->NotifyAddressBookChanged,address,strName,iVar2 != ISMINE_NO,
                   args_3._M_value,local_a8);
      goto LAB_0014d03d;
    }
    wallet_fmt = "Error: fail to write address book \'name\' entry\n";
  }
  WalletLogPrintf<>(this,(ConstevalFormatString<0U>)wallet_fmt);
  bVar1 = false;
LAB_0014d03d:
  std::__cxx11::string::~string((string *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::SetAddressBookWithDB(WalletBatch& batch, const CTxDestination& address, const std::string& strName, const std::optional<AddressPurpose>& new_purpose)
{
    bool fUpdated = false;
    bool is_mine;
    std::optional<AddressPurpose> purpose;
    {
        LOCK(cs_wallet);
        std::map<CTxDestination, CAddressBookData>::iterator mi = m_address_book.find(address);
        fUpdated = mi != m_address_book.end() && !mi->second.IsChange();

        CAddressBookData& record = mi != m_address_book.end() ? mi->second : m_address_book[address];
        record.SetLabel(strName);
        is_mine = IsMine(address) != ISMINE_NO;
        if (new_purpose) { /* update purpose only if requested */
            record.purpose = new_purpose;
        }
        purpose = record.purpose;
    }

    const std::string& encoded_dest = EncodeDestination(address);
    if (new_purpose && !batch.WritePurpose(encoded_dest, PurposeToString(*new_purpose))) {
        WalletLogPrintf("Error: fail to write address book 'purpose' entry\n");
        return false;
    }
    if (!batch.WriteName(encoded_dest, strName)) {
        WalletLogPrintf("Error: fail to write address book 'name' entry\n");
        return false;
    }

    // In very old wallets, address purpose may not be recorded so we derive it from IsMine
    NotifyAddressBookChanged(address, strName, is_mine,
                             purpose.value_or(is_mine ? AddressPurpose::RECEIVE : AddressPurpose::SEND),
                             (fUpdated ? CT_UPDATED : CT_NEW));
    return true;
}